

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringList.h
# Opt level: O1

void __thiscall llbuild::basic::StringList::encode(StringList *this,BinaryEncoder *coder)

{
  uint64_t uVar1;
  size_t in_RCX;
  void *in_RDX;
  void *__buf;
  
  uVar1 = this->size;
  BinaryEncoder::write(coder,(int)uVar1,in_RDX,in_RCX);
  BinaryEncoder::write(coder,(int)(uVar1 >> 0x20),__buf,in_RCX);
  llvm::SmallVectorImpl<unsigned_char>::insert<char_const*,void>
            ((SmallVectorImpl<unsigned_char> *)coder,
             (iterator)
             ((ulong)(coder->encdata).super_SmallVectorImpl<unsigned_char>.
                     super_SmallVectorTemplateBase<unsigned_char,_true>.
                     super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.Size
             + (long)(coder->encdata).super_SmallVectorImpl<unsigned_char>.
                     super_SmallVectorTemplateBase<unsigned_char,_true>.
                     super_SmallVectorTemplateCommon<unsigned_char,_void>.super_SmallVectorBase.
                     BeginX),this->contents,this->contents + this->size);
  return;
}

Assistant:

void encode(BinaryEncoder& coder) const {
    coder.write(size);
    coder.writeBytes(StringRef(contents, size));
  }